

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_newclosure(HSQUIRRELVM v,SQFUNCTION func,SQUnsignedInteger nfreevars)

{
  SQFUNCTION this;
  SQObjectPtr *obj;
  SQObjectPtr local_40;
  SQNativeClosure *local_30;
  SQUnsignedInteger i;
  SQNativeClosure *nc;
  SQUnsignedInteger nfreevars_local;
  SQFUNCTION func_local;
  HSQUIRRELVM v_local;
  
  nc = (SQNativeClosure *)nfreevars;
  nfreevars_local = (SQUnsignedInteger)func;
  func_local = (SQFUNCTION)v;
  i = (SQUnsignedInteger)SQNativeClosure::Create(v->_sharedstate,func,nfreevars);
  ((SQNativeClosure *)i)->_nparamscheck = 0;
  for (local_30 = (SQNativeClosure *)0x0; this = func_local, local_30 < nc;
      local_30 = (SQNativeClosure *)
                 ((long)&(local_30->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1))
  {
    obj = SQVM::Top((SQVM *)func_local);
    SQObjectPtr::operator=((SQObjectPtr *)(*(long *)(i + 0x50) + (long)local_30 * 0x10),obj);
    SQVM::Pop((SQVM *)func_local);
  }
  SQObjectPtr::SQObjectPtr(&local_40,(SQNativeClosure *)i);
  SQVM::Push((SQVM *)this,&local_40);
  SQObjectPtr::~SQObjectPtr(&local_40);
  return;
}

Assistant:

void sq_newclosure(HSQUIRRELVM v,SQFUNCTION func,SQUnsignedInteger nfreevars)
{
    SQNativeClosure *nc = SQNativeClosure::Create(_ss(v), func,nfreevars);
    nc->_nparamscheck = 0;
    for(SQUnsignedInteger i = 0; i < nfreevars; i++) {
        nc->_outervalues[i] = v->Top();
        v->Pop();
    }
    v->Push(SQObjectPtr(nc));
}